

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Al<(moira::Mode)8,_2> wrapper)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  UInt local_2c [2];
  UInt local_24;
  Ea<(moira::Mode)8,_2> *local_20;
  Ea<(moira::Mode)8,_2> *ea;
  StrWriter *this_local;
  Al<(moira::Mode)8,_2> wrapper_local;
  
  SVar1 = this->style->syntax;
  local_20 = wrapper.ea;
  ea = (Ea<(moira::Mode)8,_2> *)this;
  this_local = (StrWriter *)wrapper.ea;
  if (MOIRA_MIT < SVar1) {
    if (SVar1 - GNU < 2) {
      UInt::UInt(local_2c,(wrapper.ea)->ext1);
      operator<<(this,local_2c[0]);
      return this;
    }
    if (SVar1 != MUSASHI) {
      return this;
    }
  }
  UInt::UInt(&local_24,(wrapper.ea)->ext1);
  pSVar2 = operator<<(this,local_24);
  operator<<(pSVar2);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Al<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MOIRA_MIT:
        case Syntax::MUSASHI:

            *this << UInt(ea.ext1) << Sz<Long>{};
            break;

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *this << UInt(ea.ext1);
            break;
    }

    return *this;
}